

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

size_t nhdp_domain_encode_willingness_tlvvalue(uint8_t *tlvvalue,size_t tlvsize)

{
  list_entity *plVar1;
  ulong uVar2;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  size_t len;
  size_t idx;
  uint8_t value;
  nhdp_domain *domain;
  size_t tlvsize_local;
  uint8_t *tlvvalue_local;
  
  memset(tlvvalue,0,tlvsize);
  __tempptr = (list_entity *)0x0;
  *tlvvalue = _flooding_domain.local_willingness;
  plVar1 = _domain_list.next;
  if ((log_global_mask[LOG_NHDP_W] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_W,"src/nhdp/nhdp/nhdp_domain.c",0x346,(void *)0x0,0,
             "Set flooding willingness: %u",(uint)_flooding_domain.local_willingness);
    plVar1 = _domain_list.next;
  }
  while( true ) {
    if (plVar1->prev == _domain_list.prev) {
      return (size_t)__tempptr;
    }
    uVar2 = (ulong)((*(int *)((long)&plVar1[-0x27].next + 4) + 1) / 2);
    if (tlvsize <= uVar2) break;
    if (__tempptr < (list_entity *)(uVar2 + 1)) {
      __tempptr = (list_entity *)(uVar2 + 1);
    }
    idx._7_1_ = *(byte *)&plVar1[-0x27].next & 0xf;
    if (((ulong)plVar1[-0x27].next & 0x100000000) == 0) {
      idx._7_1_ = idx._7_1_ << 4;
    }
    if ((log_global_mask[LOG_NHDP_W] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_W,"src/nhdp/nhdp/nhdp_domain.c",0x35b,(void *)0x0,0,
               "Set routing willingness for domain %u: %x (%zu)",
               (uint)*(byte *)((long)&plVar1[-0x27].next + 1),(uint)idx._7_1_,uVar2);
    }
    tlvvalue[uVar2] = tlvvalue[uVar2] | idx._7_1_;
    plVar1 = plVar1->next;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t
nhdp_domain_encode_willingness_tlvvalue(uint8_t *tlvvalue, size_t tlvsize) {
  struct nhdp_domain *domain;
  uint8_t value;
  size_t idx, len;

  memset(tlvvalue, 0, tlvsize);
  len = 0;

  /* set flooding willingness */
  tlvvalue[0] = _flooding_domain.local_willingness;
  OONF_DEBUG(LOG_NHDP_W, "Set flooding willingness: %u", _flooding_domain.local_willingness);

  /* set routing willingness */
  list_for_each_element(&_domain_list, domain, _node) {
    idx = (domain->index + 1) / 2;
    if (idx >= tlvsize) {
      return -1;
    }
    if (idx + 1 > len) {
      len = idx + 1;
    }

    value = domain->local_willingness & RFC7181_WILLINGNESS_MASK;

    if ((domain->index & 1) == 0) {
      value <<= RFC7181_WILLINGNESS_SHIFT;
    }

    OONF_DEBUG(LOG_NHDP_W,
      "Set routing willingness for domain %u: %x"
      " (%" PRINTF_SIZE_T_SPECIFIER ")",
      domain->ext, value, idx);

    tlvvalue[idx] |= value;
  }

  return len;
}